

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaDup.c
# Opt level: O2

Gia_Man_t * Gia_ManDupTopAnd_iter(Gia_Man_t *p,int fVerbose)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  Vec_Int_t *p_00;
  Vec_Int_t *vLits;
  Gia_Obj_t *pGVar5;
  int *pCi2Lit;
  void *__s;
  Gia_Man_t *pGVar6;
  size_t __size;
  int iVar7;
  uint uVar8;
  Vec_Int_t *pVVar9;
  long lVar10;
  uint local_4c;
  
  p_00 = Vec_IntAlloc(1000);
  vLits = Vec_IntAlloc(1000);
  for (iVar7 = 0; iVar7 < p->vCos->nSize; iVar7 = iVar7 + 1) {
    pGVar5 = Gia_ManCo(p,iVar7);
    if (pGVar5 == (Gia_Obj_t *)0x0) break;
    if ((~*(ulong *)(pGVar5 + -(ulong)((uint)*(undefined8 *)pGVar5 & 0x1fffffff)) &
        0x1fffffff1fffffff) != 0) {
      if (((uint)*(undefined8 *)pGVar5 >> 0x1d & 1) == 0) {
        iVar1 = Gia_ObjFaninId0p(p,pGVar5);
        pVVar9 = p_00;
      }
      else {
        iVar1 = Gia_ObjFaninLit0p(p,pGVar5);
        pVVar9 = vLits;
      }
      Vec_IntPush(pVVar9,iVar1);
    }
  }
  iVar7 = p_00->nSize;
  if (iVar7 == 0) {
    if (fVerbose != 0) {
      puts("The AIG cannot be decomposed using AND-decomposition.");
    }
    Vec_IntFree(p_00);
LAB_001da44d:
    Vec_IntFree(vLits);
    pGVar6 = Gia_ManDupNormalize(p,0);
    return pGVar6;
  }
  for (iVar1 = 0; iVar1 < iVar7; iVar1 = iVar1 + 1) {
    iVar7 = Vec_IntEntry(p_00,iVar1);
    pGVar5 = Gia_ManObj(p,iVar7);
    if (pGVar5 == (Gia_Obj_t *)0x0) break;
    uVar8 = (uint)*(undefined8 *)pGVar5;
    if ((uVar8 & 0x9fffffff) == 0x9fffffff) {
      iVar7 = Gia_ObjId(p,pGVar5);
      uVar8 = 0;
LAB_001da24d:
      iVar7 = Abc_Var2Lit(iVar7,uVar8);
      pVVar9 = vLits;
    }
    else {
      if (((int)uVar8 < 0) || ((uVar8 & 0x1fffffff) == 0x1fffffff)) {
        __assert_fail("Gia_ObjIsAnd(pObj)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaDup.c"
                      ,0xa18,"Gia_Man_t *Gia_ManDupTopAnd_iter(Gia_Man_t *, int)");
      }
      if ((uVar8 >> 0x1d & 1) == 0) {
        iVar7 = Gia_ObjFaninId0p(p,pGVar5);
        pVVar9 = p_00;
      }
      else {
        iVar7 = Gia_ObjFaninLit0p(p,pGVar5);
        pVVar9 = vLits;
      }
      Vec_IntPush(pVVar9,iVar7);
      if ((pGVar5->field_0x7 & 0x20) != 0) {
        iVar7 = Gia_ObjFaninId1p(p,pGVar5);
        uVar8 = (uint)((ulong)*(undefined8 *)pGVar5 >> 0x3d) & 1;
        goto LAB_001da24d;
      }
      iVar7 = Gia_ObjFaninId1p(p,pGVar5);
      pVVar9 = p_00;
    }
    Vec_IntPush(pVVar9,iVar7);
    iVar7 = p_00->nSize;
  }
  Vec_IntFree(p_00);
  __size = (size_t)p->nObjs;
  pCi2Lit = (int *)malloc(__size * 4);
  memset(pCi2Lit,0xff,__size * 4);
  __s = malloc(__size);
  memset(__s,0xff,__size);
  iVar7 = vLits->nSize;
  local_4c = 0;
  for (iVar1 = 0; iVar1 < iVar7; iVar1 = iVar1 + 1) {
    iVar2 = Vec_IntEntry(vLits,iVar1);
    uVar8 = Abc_Lit2Var(iVar2);
    pGVar5 = Gia_ManObj(p,uVar8);
    if (((undefined1  [12])*pGVar5 & (undefined1  [12])0x9fffffff) == (undefined1  [12])0x9fffffff)
    {
      uVar3 = Abc_LitIsCompl(iVar2);
      uVar4 = Gia_ObjCioId(pGVar5);
      pCi2Lit[uVar4] = uVar3 ^ 1;
      local_4c = local_4c + 1;
    }
    uVar3 = (uint)*(byte *)((long)__s + (ulong)uVar8);
    if (uVar3 < 2) {
      uVar8 = Abc_LitIsCompl(iVar2);
      if (uVar8 != uVar3) {
        puts("Problem is trivially UNSAT.");
        free(pCi2Lit);
        free(__s);
        goto LAB_001da44d;
      }
    }
    else {
      iVar2 = Abc_LitIsCompl(iVar2);
      *(char *)((long)__s + (ulong)uVar8) = (char)iVar2;
    }
  }
  vLits->nSize = 0;
  for (lVar10 = 0; lVar10 < p->nObjs; lVar10 = lVar10 + 1) {
    pGVar5 = Gia_ManObj(p,(int)lVar10);
    if (pGVar5 == (Gia_Obj_t *)0x0) break;
    if ((((undefined1  [12])*pGVar5 & (undefined1  [12])0x9fffffff) != (undefined1  [12])0x9fffffff)
       && (*(byte *)((long)__s + lVar10) < 2)) {
      iVar7 = Abc_Var2Lit((int)lVar10,(uint)*(byte *)((long)__s + lVar10));
      Vec_IntPush(vLits,iVar7);
    }
  }
  if (fVerbose != 0) {
    printf("Detected %6d AND leaves and %6d CI leaves.\n",(ulong)(uint)vLits->nSize,(ulong)local_4c)
    ;
  }
  if (local_4c == 0) {
    pGVar6 = Gia_ManDupDfsLitArray(p,vLits);
  }
  else {
    pGVar6 = Gia_ManDupDfsCiMap(p,pCi2Lit,vLits);
  }
  free(pCi2Lit);
  free(__s);
  Vec_IntFree(vLits);
  return pGVar6;
}

Assistant:

Gia_Man_t * Gia_ManDupTopAnd_iter( Gia_Man_t * p, int fVerbose )  
{
    Gia_Man_t * pNew;
    Gia_Obj_t * pObj;
    Vec_Int_t * vFront, * vLeaves;
    int i, iLit, iObjId, nCiLits, * pCi2Lit;
    char * pVar2Val;
    // collect the frontier
    vFront = Vec_IntAlloc( 1000 );
    vLeaves = Vec_IntAlloc( 1000 );
    Gia_ManForEachCo( p, pObj, i )
    {
        if ( Gia_ObjIsConst0( Gia_ObjFanin0(pObj) ) )
            continue;
        if ( Gia_ObjFaninC0(pObj) )
            Vec_IntPush( vLeaves, Gia_ObjFaninLit0p(p, pObj) );
        else
            Vec_IntPush( vFront, Gia_ObjFaninId0p(p, pObj) );
    }
    if ( Vec_IntSize(vFront) == 0 )
    {
        if ( fVerbose )
            printf( "The AIG cannot be decomposed using AND-decomposition.\n" );
        Vec_IntFree( vFront );
        Vec_IntFree( vLeaves );
        return Gia_ManDupNormalize( p, 0 );
    }
    // expand the frontier
    Gia_ManForEachObjVec( vFront, p, pObj, i )
    {
        if ( Gia_ObjIsCi(pObj) )
        {
            Vec_IntPush( vLeaves, Abc_Var2Lit( Gia_ObjId(p, pObj), 0 ) );
            continue;
        }
        assert( Gia_ObjIsAnd(pObj) );
        if ( Gia_ObjFaninC0(pObj) )
            Vec_IntPush( vLeaves, Gia_ObjFaninLit0p(p, pObj) );
        else
            Vec_IntPush( vFront, Gia_ObjFaninId0p(p, pObj) );
        if ( Gia_ObjFaninC1(pObj) )
            Vec_IntPush( vLeaves, Gia_ObjFaninLit1p(p, pObj) );
        else
            Vec_IntPush( vFront, Gia_ObjFaninId1p(p, pObj) );
    }
    Vec_IntFree( vFront );
    // sort the literals
    nCiLits = 0;
    pCi2Lit = ABC_FALLOC( int, Gia_ManObjNum(p) );
    pVar2Val = ABC_FALLOC( char, Gia_ManObjNum(p) );
    Vec_IntForEachEntry( vLeaves, iLit, i )
    {
        iObjId = Abc_Lit2Var(iLit);
        pObj = Gia_ManObj(p, iObjId);
        if ( Gia_ObjIsCi(pObj) )
        {
            pCi2Lit[Gia_ObjCioId(pObj)] = !Abc_LitIsCompl(iLit);
            nCiLits++;
        }
        if ( pVar2Val[iObjId] != 0 && pVar2Val[iObjId] != 1 )
            pVar2Val[iObjId] = Abc_LitIsCompl(iLit);
        else if ( pVar2Val[iObjId] != Abc_LitIsCompl(iLit) )
            break;
    }
    if ( i < Vec_IntSize(vLeaves) )
    {
        printf( "Problem is trivially UNSAT.\n" );
        ABC_FREE( pCi2Lit );
        ABC_FREE( pVar2Val );
        Vec_IntFree( vLeaves );
        return Gia_ManDupNormalize( p, 0 );
    }
    // create array of input literals
    Vec_IntClear( vLeaves );
    Gia_ManForEachObj( p, pObj, i )
        if ( !Gia_ObjIsCi(pObj) && (pVar2Val[i] == 0 || pVar2Val[i] == 1) )
            Vec_IntPush( vLeaves, Abc_Var2Lit(i, pVar2Val[i]) );
    if ( fVerbose )
        printf( "Detected %6d AND leaves and %6d CI leaves.\n", Vec_IntSize(vLeaves), nCiLits );
    // create the input map
    if ( nCiLits == 0 )
        pNew = Gia_ManDupDfsLitArray( p, vLeaves );
    else
        pNew = Gia_ManDupDfsCiMap( p, pCi2Lit, vLeaves );
    ABC_FREE( pCi2Lit );
    ABC_FREE( pVar2Val );
    Vec_IntFree( vLeaves );
    return pNew;
}